

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_CheckEqualFailureWithText_Test::testBody
          (TEST_TestFailure_CheckEqualFailureWithText_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_c8 [88];
  CheckEqualFailure f;
  TEST_TestFailure_CheckEqualFailureWithText_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  f.super_TestFailure.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)(local_c8 + 0x40),"expected");
  SimpleString::SimpleString((SimpleString *)(local_c8 + 0x30),"actual");
  SimpleString::SimpleString((SimpleString *)(local_c8 + 0x10),"text");
  CheckEqualFailure::CheckEqualFailure
            ((CheckEqualFailure *)(local_c8 + 0x50),pUVar1,fileName,2,
             (SimpleString *)(local_c8 + 0x40),(SimpleString *)(local_c8 + 0x30),
             (SimpleString *)(local_c8 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_c8 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_c8 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_c8 + 0x40));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_c8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_c8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "Message: text\n\texpected <expected>\n\tbut was  <actual>\n\tdifference starts at position 0 at: <          actual    >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x62,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_c8);
  CheckEqualFailure::~CheckEqualFailure((CheckEqualFailure *)(local_c8 + 0x50));
  return;
}

Assistant:

TEST(TestFailure, CheckEqualFailureWithText)
{
    CheckEqualFailure f(test, failFileName, failLineNumber, "expected", "actual", "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <expected>\n"
                  "\tbut was  <actual>\n"
                  "\tdifference starts at position 0 at: <          actual    >\n"
                  "\t                                               ^", f);
}